

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexFilters.cpp
# Opt level: O2

PtexFilter * Ptex::v2_2::PtexFilter::getFilter(PtexTexture *tex,Options *opts)

{
  PtexFilter PVar1;
  int iVar2;
  PtexFilter *pPVar3;
  undefined **ppuVar4;
  PtexBicubicFilter *this;
  
  iVar2 = (*tex->_vptr_PtexTexture[5])();
  if (iVar2 == 0) {
    if (opts->filter != f_point) {
      pPVar3 = (PtexFilter *)operator_new(0x48);
      pPVar3->_vptr_PtexFilter = (_func_int **)&PTR__PtexFilter_03145ba0;
      pPVar3[1]._vptr_PtexFilter = (_func_int **)tex;
      PVar1._vptr_PtexFilter = *(_func_int ***)&opts->lerp;
      pPVar3[2]._vptr_PtexFilter = *(_func_int ***)opts;
      pPVar3[3]._vptr_PtexFilter = PVar1._vptr_PtexFilter;
      *(undefined4 *)&pPVar3[4]._vptr_PtexFilter = *(undefined4 *)&opts->noedgeblend;
      pPVar3[5]._vptr_PtexFilter = (_func_int **)0x0;
      pPVar3[6]._vptr_PtexFilter = (_func_int **)0x0;
      *(undefined8 *)((long)&pPVar3[6]._vptr_PtexFilter + 4) = 0;
      *(undefined8 *)((long)&pPVar3[7]._vptr_PtexFilter + 4) = 0;
      return pPVar3;
    }
    this = (PtexBicubicFilter *)operator_new(0x10);
    ppuVar4 = &PTR__PtexFilter_031454d0;
LAB_00561f36:
    (this->super_PtexWidth4Filter).super_PtexSeparableFilter.super_PtexFilter._vptr_PtexFilter =
         (_func_int **)ppuVar4;
    (this->super_PtexWidth4Filter).super_PtexSeparableFilter._tx = tex;
  }
  else {
    if (iVar2 != 1) {
      return (PtexFilter *)0x0;
    }
    switch(opts->filter) {
    case f_point:
      this = (PtexBicubicFilter *)operator_new(0x10);
      ppuVar4 = &PTR__PtexFilter_031452e8;
      goto LAB_00561f36;
    case f_bilinear:
      this = (PtexBicubicFilter *)operator_new(0x50);
      PtexBilinearFilter::PtexBilinearFilter((PtexBilinearFilter *)this,tex,opts);
      break;
    default:
      this = (PtexBicubicFilter *)operator_new(0x50);
      PtexBoxFilter::PtexBoxFilter((PtexBoxFilter *)this,tex,opts);
      break;
    case f_gaussian:
      this = (PtexBicubicFilter *)operator_new(0x60);
      PtexGaussianFilter::PtexGaussianFilter((PtexGaussianFilter *)this,tex,opts);
      break;
    case f_bicubic:
      this = (PtexBicubicFilter *)operator_new(0x80);
      PtexBicubicFilter::PtexBicubicFilter(this,tex,opts,opts->sharpness);
      break;
    case f_bspline:
      this = (PtexBicubicFilter *)operator_new(0x80);
      PtexBicubicFilter::PtexBicubicFilter(this,tex,opts,0.0);
      break;
    case f_catmullrom:
      this = (PtexBicubicFilter *)operator_new(0x80);
      PtexBicubicFilter::PtexBicubicFilter(this,tex,opts,1.0);
      break;
    case f_mitchell:
      this = (PtexBicubicFilter *)operator_new(0x80);
      PtexBicubicFilter::PtexBicubicFilter(this,tex,opts,0.6666667);
    }
  }
  return (PtexFilter *)this;
}

Assistant:

PtexFilter* PtexFilter::getFilter(PtexTexture* tex, const PtexFilter::Options& opts)
{
    switch (tex->meshType()) {
    case Ptex::mt_quad:
        switch (opts.filter) {
        case f_point:       return new PtexPointFilter(tex);
        case f_bilinear:    return new PtexBilinearFilter(tex, opts);
        default:
        case f_box:         return new PtexBoxFilter(tex, opts);
        case f_gaussian:    return new PtexGaussianFilter(tex, opts);
        case f_bicubic:     return new PtexBicubicFilter(tex, opts, opts.sharpness);
        case f_bspline:     return new PtexBicubicFilter(tex, opts, 0.f);
        case f_catmullrom:  return new PtexBicubicFilter(tex, opts, 1.f);
        case f_mitchell:    return new PtexBicubicFilter(tex, opts, 2.f/3.f);
        }
        break;

    case Ptex::mt_triangle:
        switch (opts.filter) {
        case f_point:       return new PtexPointFilterTri(tex);
        default:            return new PtexTriangleFilter(tex, opts);
        }
        break;
    }
    return 0;
}